

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::cord_internal::anon_unknown_16::CordRepAnalyzer::CountFlat
          (CordRepAnalyzer *this,size_t size)

{
  size_t size_local;
  CordRepAnalyzer *this_local;
  
  this->statistics_->node_count = this->statistics_->node_count + 1;
  (this->statistics_->node_counts).flat = (this->statistics_->node_counts).flat + 1;
  if (size < 0x41) {
    (this->statistics_->node_counts).flat_64 = (this->statistics_->node_counts).flat_64 + 1;
  }
  else if (size < 0x81) {
    (this->statistics_->node_counts).flat_128 = (this->statistics_->node_counts).flat_128 + 1;
  }
  else if (size < 0x101) {
    (this->statistics_->node_counts).flat_256 = (this->statistics_->node_counts).flat_256 + 1;
  }
  else if (size < 0x201) {
    (this->statistics_->node_counts).flat_512 = (this->statistics_->node_counts).flat_512 + 1;
  }
  else if (size < 0x401) {
    (this->statistics_->node_counts).flat_1k = (this->statistics_->node_counts).flat_1k + 1;
  }
  return;
}

Assistant:

void CountFlat(size_t size) {
    statistics_.node_count++;
    statistics_.node_counts.flat++;
    if (size <= 64) {
      statistics_.node_counts.flat_64++;
    } else if (size <= 128) {
      statistics_.node_counts.flat_128++;
    } else if (size <= 256) {
      statistics_.node_counts.flat_256++;
    } else if (size <= 512) {
      statistics_.node_counts.flat_512++;
    } else if (size <= 1024) {
      statistics_.node_counts.flat_1k++;
    }
  }